

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_compress.cpp
# Opt level: O2

void duckdb_zstd::HUF_simpleQuickSort(nodeElt *arr,int low,int high)

{
  uint uVar1;
  nodeElt nVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  
  iVar3 = high - low;
  if (7 < iVar3) {
    do {
      lVar7 = (long)high;
      while( true ) {
        if (high <= low) {
          return;
        }
        uVar1 = arr[lVar7].count;
        iVar3 = low + -1;
        for (lVar4 = (long)low; lVar7 != lVar4; lVar4 = lVar4 + 1) {
          if (uVar1 < arr[lVar4].count) {
            nVar2 = arr[(long)iVar3 + 1];
            arr[(long)iVar3 + 1] = arr[lVar4];
            arr[lVar4] = nVar2;
            iVar3 = iVar3 + 1;
          }
        }
        nVar2 = arr[(long)iVar3 + 1];
        arr[(long)iVar3 + 1] = arr[lVar7];
        arr[lVar7] = nVar2;
        if (high - (iVar3 + 1) <= (iVar3 + 1) - low) break;
        HUF_simpleQuickSort(arr,low,iVar3);
        low = iVar3 + 2;
      }
      HUF_simpleQuickSort(arr,iVar3 + 2,high);
      high = iVar3;
    } while( true );
  }
  if (iVar3 < 1) {
    iVar3 = 0;
  }
  uVar5 = 1;
  do {
    if (uVar5 == iVar3 + 1) {
      return;
    }
    nVar2 = arr[(long)low + uVar5];
    for (uVar6 = uVar5; 0 < (long)uVar6; uVar6 = uVar6 - 1) {
      if (nVar2.count <= arr[(long)low + (uVar6 - 1)].count) goto LAB_003ae8e6;
      arr[(long)low + uVar6] = arr[(long)low + (uVar6 - 1)];
    }
    uVar6 = 0;
LAB_003ae8e6:
    arr[(long)low + (long)(int)uVar6] = nVar2;
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

static void HUF_simpleQuickSort(nodeElt arr[], int low, int high) {
    int const kInsertionSortThreshold = 8;
    if (high - low < kInsertionSortThreshold) {
        HUF_insertionSort(arr, low, high);
        return;
    }
    while (low < high) {
        int const idx = HUF_quickSortPartition(arr, low, high);
        if (idx - low < high - idx) {
            HUF_simpleQuickSort(arr, low, idx - 1);
            low = idx + 1;
        } else {
            HUF_simpleQuickSort(arr, idx + 1, high);
            high = idx - 1;
        }
    }
}